

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O1

void __thiscall nivalis::Plotter::handle_mouse_move(Plotter *this,int px,int py)

{
  pointer pPVar1;
  undefined4 uVar2;
  pointer pPVar3;
  undefined4 uVar5;
  pointer puVar4;
  double dVar6;
  double dVar7;
  double dVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  float fVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 auVar17 [16];
  
  uVar9 = (ulong)this->drag_marker;
  if ((uVar9 == 0xffffffffffffffff) ||
     (pPVar3 = (this->pt_markers).
               super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>.
               _M_impl.super__Vector_impl_data._M_start,
     uVar11 = ((long)(this->pt_markers).
                     super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 3) *
              0x6db6db6db6db6db7, uVar11 < uVar9 || uVar11 - uVar9 == 0)) {
LAB_0012b8a5:
    if (this->drag_view != true) {
      if (-1 < (py | px)) {
        uVar9 = (ulong)((this->view).swid * py + px);
        puVar4 = (this->grid).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((uVar9 < (ulong)((long)(this->grid).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3))
           && (puVar4[uVar9] != 0xffffffffffffffff)) {
          detect_marker_click(this,px,py,(bool)(this->drag_trace ^ 1),false);
          return;
        }
      }
      (this->marker_text)._M_string_length = 0;
      *(this->marker_text)._M_dataplus._M_p = '\0';
      return;
    }
    iVar12 = this->dragx;
    iVar13 = this->dragy;
    this->dragx = px;
    this->dragy = py;
    dVar15 = (this->view).xmax;
    dVar6 = (this->view).xmin;
    dVar7 = (this->view).ymax;
    dVar8 = (this->view).ymin;
    dVar22 = ((dVar15 - dVar6) / (double)(this->view).swid) * (double)(px - iVar12);
    (this->view).xmax = dVar15 - dVar22;
    (this->view).xmin = dVar6 - dVar22;
    dVar15 = ((dVar7 - dVar8) / (double)(this->view).shigh) * (double)(py - iVar13);
    (this->view).ymax = dVar15 + dVar7;
    (this->view).ymin = dVar15 + dVar8;
  }
  else {
    pPVar1 = pPVar3 + uVar9;
    if (pPVar3[uVar9].drag_var_x == 0xffffffffffffffff) {
      if (pPVar1->drag_var_y == 0xffffffffffffffff) goto LAB_0012b8a5;
    }
    else {
      dVar15 = (this->view).xmin;
      (this->env).vars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[pPVar3[uVar9].drag_var_x] =
           (((this->view).xmax - dVar15) * (double)px) / (double)(this->view).swid + dVar15;
    }
    if (pPVar1->drag_var_y != 0xffffffffffffffff) {
      iVar12 = (this->view).shigh;
      dVar15 = (this->view).ymin;
      (this->env).vars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[pPVar1->drag_var_y] =
           (((this->view).ymax - dVar15) * (double)(iVar12 - py)) / (double)iVar12 + dVar15;
    }
    dVar6 = (this->view).xmin;
    uVar2 = (this->view).swid;
    uVar5 = (this->view).shigh;
    dVar15 = (this->view).ymax;
    auVar20._0_8_ = (double)(int)uVar2 * (pPVar1->x - dVar6);
    auVar20._8_8_ = (double)(int)uVar5 * (dVar15 - pPVar1->y);
    auVar21._0_8_ = (this->view).xmax - dVar6;
    auVar21._8_8_ = dVar15 - (this->view).ymin;
    auVar21 = divpd(auVar20,auVar21);
    auVar16._4_4_ = (float)auVar21._8_8_;
    auVar16._0_4_ = (float)auVar21._0_8_;
    auVar16._8_8_ = 0;
    auVar16 = maxps(ZEXT816(0),auVar16);
    fVar14 = (float)(int)uVar5 + -1.0;
    iVar12 = -(uint)((float)(int)uVar2 + -1.0 < auVar16._0_4_);
    iVar13 = -(uint)(fVar14 < auVar16._4_4_);
    auVar18._4_4_ = iVar13;
    auVar18._0_4_ = iVar12;
    auVar18._8_4_ = iVar13;
    auVar18._12_4_ = iVar13;
    auVar17._8_8_ = auVar18._8_8_;
    auVar17._4_4_ = iVar12;
    auVar17._0_4_ = iVar12;
    uVar10 = movmskpd((int)pPVar1,auVar17);
    fVar19 = (float)(int)uVar2 + -1.0;
    if ((uVar10 & 1) == 0) {
      fVar19 = auVar16._0_4_;
    }
    if ((uVar10 & 2) == 0) {
      fVar14 = auVar16._4_4_;
    }
    if ((this->grid).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar2 * (int)(fVar14 + 0.5) + (int)(fVar19 + 0.5)] !=
        0xffffffffffffffff) {
      detect_marker_click(this,(int)(fVar19 + 0.5),(int)(fVar14 + 0.5),true,false);
    }
  }
  this->require_update = true;
  return;
}

Assistant:

void Plotter::handle_mouse_move(int px, int py) {
    if (~drag_marker &&
        drag_marker < pt_markers.size() &&
            (~pt_markers[drag_marker].drag_var_x ||
             ~pt_markers[drag_marker].drag_var_y)) {
        // Draggable marker
        auto& ptm = pt_markers[drag_marker];
        if (~ptm.drag_var_x) {
            env.vars[ptm.drag_var_x] = _SX_TO_X(px);
        }
        if (~ptm.drag_var_y) {
            env.vars[ptm.drag_var_y] = _SY_TO_Y(py);
        }
        int sx = (int)(std::min(std::max(_X_TO_SX(ptm.x), 0.f), (float) view.swid - 1.f) + 0.5f);
        int sy = (int)(std::min(std::max(_Y_TO_SY(ptm.y), 0.f), (float) view.shigh - 1.f) + 0.5f);
        if (~grid[sy * view.swid + sx]) detect_marker_click(sx, sy, true, false);
        require_update = true;
        return;
    }
    if (drag_view) {
        // Dragging background
        int dx = px - dragx;
        int dy = py - dragy;
        dragx = px; dragy = py;
        double fx = (view.xmax - view.xmin) / view.swid * dx;
        double fy = (view.ymax - view.ymin) / view.shigh * dy;
        view.xmax -= fx; view.xmin -= fx;
        view.ymax += fy; view.ymin += fy;
        require_update = true;
    } else if (px >= 0 && py >= 0 &&
            py * view.swid + px < grid.size() &&
            ~grid[py * view.swid + px]) {
        // Trace drag mode
        // Show marker if point marker under cursor
        detect_marker_click(px, py, !drag_trace, false);
    } else {
        marker_text.clear();
    }
}